

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

bool __thiscall FStateDefinitions::SetGotoLabel(FStateDefinitions *this,char *string)

{
  FState *pFVar1;
  char *string_local;
  FStateDefinitions *this_local;
  
  if (this->laststate == (FState *)0x0) {
    if (this->lastlabel < 0) {
      this_local._7_1_ = false;
    }
    else {
      RetargetStates(this,this->lastlabel + 1,string);
      if (this->laststatebeforelabel != (FState *)0x0) {
        pFVar1 = (FState *)copystring(string);
        this->laststatebeforelabel->NextState = pFVar1;
        this->laststatebeforelabel->DefineFlags = '\x04';
        this->laststatebeforelabel = (FState *)0x0;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    pFVar1 = (FState *)copystring(string);
    this->laststate->NextState = pFVar1;
    this->laststate->DefineFlags = '\x04';
    this->laststatebeforelabel = (FState *)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FStateDefinitions::SetGotoLabel(const char *string)
{
	// copy the text - this must be resolved later!
	if (laststate != NULL)
	{ // Following a state definition: Modify it.
		laststate->NextState = (FState*)copystring(string);	
		laststate->DefineFlags = SDF_LABEL;
		laststatebeforelabel = NULL;
		return true;
	}
	else if (lastlabel >= 0)
	{ // Following a label: Retarget it.
		RetargetStates (lastlabel+1, string);
		if (laststatebeforelabel != NULL)
		{
			laststatebeforelabel->NextState = (FState*)copystring(string);	
			laststatebeforelabel->DefineFlags = SDF_LABEL;
			laststatebeforelabel = NULL;
		}
		return true;
	}
	return false;
}